

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkLayer::InternalSwap
          (NeuralNetworkLayer *this,NeuralNetworkLayer *other)

{
  NeuralNetworkLayer *other_local;
  NeuralNetworkLayer *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->input_).super_RepeatedPtrFieldBase,&(other->input_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->output_).super_RepeatedPtrFieldBase,
             &(other->output_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->inputtensor_).super_RepeatedPtrFieldBase,
             &(other->inputtensor_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->outputtensor_).super_RepeatedPtrFieldBase,
             &(other->outputtensor_).super_RepeatedPtrFieldBase);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&this->name_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&other->name_);
  std::swap<bool>(&this->isupdatable_,&other->isupdatable_);
  std::swap<CoreML::Specification::NeuralNetworkLayer::LayerUnion>(&this->layer_,&other->layer_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void NeuralNetworkLayer::InternalSwap(NeuralNetworkLayer* other) {
  input_.InternalSwap(&other->input_);
  output_.InternalSwap(&other->output_);
  inputtensor_.InternalSwap(&other->inputtensor_);
  outputtensor_.InternalSwap(&other->outputtensor_);
  name_.Swap(&other->name_);
  std::swap(isupdatable_, other->isupdatable_);
  std::swap(layer_, other->layer_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(_cached_size_, other->_cached_size_);
}